

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcm2835.c
# Opt level: O2

void bcm2835_gpio_write_mask(uint32_t value,uint32_t mask)

{
  bcm2835_gpio_set_multi(mask & value);
  bcm2835_gpio_clr_multi(~value & mask);
  return;
}

Assistant:

void bcm2835_gpio_write_mask(uint32_t value, uint32_t mask)
{
    bcm2835_gpio_set_multi(value & mask);
    bcm2835_gpio_clr_multi((~value) & mask);
}